

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O3

void __thiscall
transition_table_update_existing_key_Test::TestBody(transition_table_update_existing_key_Test *this)

{
  return;
}

Assistant:

TEST(transition_table, update_existing_key) {
    auto tb1 = make_table(make_row(make_transition(
        state<s1>, event<e3>, [](auto e) { return e.value > 0; }, [] { return s2{}; }, state<s2>)));

    auto tb2 = std::move(tb1).update(make_transition(
        state<s1>, event<e3>, [](auto e) { return e.value <= 0; }, _, _));

    static_assert(decltype(tb2)::size == 1, "");

    const auto& row1 = std::get<0>(tb2.data());
    {
        const auto& transition = std::get<0>(row1.data());
        EXPECT_TRUE(transition.guard(e3{1}));
        EXPECT_FALSE(transition.guard(e3{0}));
    }
    {
        const auto& transition = std::get<1>(row1.data());
        EXPECT_FALSE(transition.guard(e3{1}));
        EXPECT_TRUE(transition.guard(e3{0}));
    }
}